

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_cpp_generator.cc
# Opt level: O1

void __thiscall
t_cpp_generator::generate_consts
          (t_cpp_generator *this,vector<t_const_*,_std::allocator<t_const_*>_> *consts)

{
  int *piVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  t_type *ttype;
  long *plVar4;
  ostream *poVar5;
  _func_int **pp_Var6;
  long *plVar7;
  pointer pptVar8;
  _Alloc_hider _Var9;
  string name;
  string f_consts_name;
  string f_consts_impl_name;
  ofstream_with_content_based_conditional_update f_consts_impl;
  ofstream_with_content_based_conditional_update f_consts;
  string local_430;
  long *local_410;
  long local_408;
  long local_400;
  long lStack_3f8;
  long *local_3f0;
  long local_3e8;
  long local_3e0;
  long lStack_3d8;
  string local_3d0;
  string local_3b0;
  string local_390;
  undefined1 local_370 [16];
  _func_int *local_360;
  long lStack_358;
  string local_300 [32];
  undefined1 local_2e0;
  ios_base local_2d8 [264];
  undefined1 local_1d0 [16];
  _func_int *local_1c0;
  long lStack_1b8;
  string local_160 [32];
  undefined1 local_140;
  ios_base local_138 [264];
  
  (*(this->super_t_oop_generator).super_t_generator._vptr_t_generator[0x1b])(local_370,this);
  plVar4 = (long *)std::__cxx11::string::_M_append
                             (local_370,
                              (ulong)(this->super_t_oop_generator).super_t_generator.program_name_.
                                     _M_dataplus._M_p);
  pp_Var6 = (_func_int **)(plVar4 + 2);
  if ((_func_int **)*plVar4 == pp_Var6) {
    local_1c0 = *pp_Var6;
    lStack_1b8 = plVar4[3];
    local_1d0._0_8_ = &local_1c0;
  }
  else {
    local_1c0 = *pp_Var6;
    local_1d0._0_8_ = (_func_int **)*plVar4;
  }
  local_1d0._8_8_ = plVar4[1];
  *plVar4 = (long)pp_Var6;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::append(local_1d0);
  local_410 = &local_400;
  plVar7 = plVar4 + 2;
  if ((long *)*plVar4 == plVar7) {
    local_400 = *plVar7;
    lStack_3f8 = plVar4[3];
  }
  else {
    local_400 = *plVar7;
    local_410 = (long *)*plVar4;
  }
  local_408 = plVar4[1];
  *plVar4 = (long)plVar7;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  if ((_func_int **)local_1d0._0_8_ != &local_1c0) {
    operator_delete((void *)local_1d0._0_8_);
  }
  if ((_func_int **)local_370._0_8_ != &local_360) {
    operator_delete((void *)local_370._0_8_);
  }
  template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::
  template_ofstream_with_content_based_conditional_update
            ((template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>
              *)local_1d0);
  if ((consts->super__Vector_base<t_const_*,_std::allocator<t_const_*>_>)._M_impl.
      super__Vector_impl_data._M_finish !=
      (consts->super__Vector_base<t_const_*,_std::allocator<t_const_*>_>)._M_impl.
      super__Vector_impl_data._M_start) {
    std::__cxx11::string::_M_assign(local_160);
    template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::
    clear_buf((template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>
               *)local_1d0);
    local_140 = 0;
    (*(this->super_t_oop_generator).super_t_generator._vptr_t_generator[0x1b])(&local_430,this);
    plVar4 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_430,
                                (ulong)(this->super_t_oop_generator).super_t_generator.program_name_
                                       ._M_dataplus._M_p);
    pp_Var6 = (_func_int **)(plVar4 + 2);
    if ((_func_int **)*plVar4 == pp_Var6) {
      local_360 = *pp_Var6;
      lStack_358 = plVar4[3];
      local_370._0_8_ = &local_360;
    }
    else {
      local_360 = *pp_Var6;
      local_370._0_8_ = (_func_int **)*plVar4;
    }
    local_370._8_8_ = plVar4[1];
    *plVar4 = (long)pp_Var6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    plVar4 = (long *)std::__cxx11::string::append(local_370);
    local_3f0 = &local_3e0;
    plVar7 = plVar4 + 2;
    if ((long *)*plVar4 == plVar7) {
      local_3e0 = *plVar7;
      lStack_3d8 = plVar4[3];
    }
    else {
      local_3e0 = *plVar7;
      local_3f0 = (long *)*plVar4;
    }
    local_3e8 = plVar4[1];
    *plVar4 = (long)plVar7;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    if ((_func_int **)local_370._0_8_ != &local_360) {
      operator_delete((void *)local_370._0_8_);
    }
    paVar2 = &local_430.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_430._M_dataplus._M_p != paVar2) {
      operator_delete(local_430._M_dataplus._M_p);
    }
    template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::
    template_ofstream_with_content_based_conditional_update
              ((template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>
                *)local_370);
    std::__cxx11::string::_M_assign(local_300);
    template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::
    clear_buf((template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>
               *)local_370);
    local_2e0 = 0;
    (*(this->super_t_oop_generator).super_t_generator._vptr_t_generator[0x1c])(&local_430,this);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1d0,local_430._M_dataplus._M_p,local_430._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_430._M_dataplus._M_p != paVar2) {
      operator_delete(local_430._M_dataplus._M_p);
    }
    (*(this->super_t_oop_generator).super_t_generator._vptr_t_generator[0x1c])(&local_430,this);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_370,local_430._M_dataplus._M_p,local_430._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_430._M_dataplus._M_p != paVar2) {
      operator_delete(local_430._M_dataplus._M_p);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1d0,"#ifndef ",8);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1d0,
                        (this->super_t_oop_generator).super_t_generator.program_name_._M_dataplus.
                        _M_p,(this->super_t_oop_generator).super_t_generator.program_name_.
                             _M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"_CONSTANTS_H",0xc);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length
                       );
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"#define ",8);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar5,(this->super_t_oop_generator).super_t_generator.program_name_.
                               _M_dataplus._M_p,
                        (this->super_t_oop_generator).super_t_generator.program_name_.
                        _M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"_CONSTANTS_H",0xc);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length
                       );
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length
                       );
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"#include \"",10);
    get_include_prefix_abi_cxx11_
              (&local_430,this,(this->super_t_oop_generator).super_t_generator.program_);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar5,local_430._M_dataplus._M_p,local_430._M_string_length);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar5,(this->super_t_oop_generator).super_t_generator.program_name_.
                               _M_dataplus._M_p,
                        (this->super_t_oop_generator).super_t_generator.program_name_.
                        _M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"_types.h\"",9);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length
                       );
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length
                       );
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar5,(this->ns_open_)._M_dataplus._M_p,(this->ns_open_)._M_string_length);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length
                       );
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_430._M_dataplus._M_p != paVar2) {
      operator_delete(local_430._M_dataplus._M_p);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_370,"#include \"",10);
    get_include_prefix_abi_cxx11_
              (&local_430,this,(this->super_t_oop_generator).super_t_generator.program_);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_370,local_430._M_dataplus._M_p,local_430._M_string_length);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar5,(this->super_t_oop_generator).super_t_generator.program_name_.
                               _M_dataplus._M_p,
                        (this->super_t_oop_generator).super_t_generator.program_name_.
                        _M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"_constants.h\"",0xd);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length
                       );
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length
                       );
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar5,(this->ns_open_)._M_dataplus._M_p,(this->ns_open_)._M_string_length);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length
                       );
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_430._M_dataplus._M_p != paVar2) {
      operator_delete(local_430._M_dataplus._M_p);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1d0,"class ",6);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1d0,
                        (this->super_t_oop_generator).super_t_generator.program_name_._M_dataplus.
                        _M_p,(this->super_t_oop_generator).super_t_generator.program_name_.
                             _M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"Constants {",0xb);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length
                       );
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," public:",8);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length
                       );
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"  ",2);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar5,(this->super_t_oop_generator).super_t_generator.program_name_.
                               _M_dataplus._M_p,
                        (this->super_t_oop_generator).super_t_generator.program_name_.
                        _M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"Constants();",0xc);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length
                       );
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
    *piVar1 = *piVar1 + 1;
    pptVar8 = (consts->super__Vector_base<t_const_*,_std::allocator<t_const_*>_>)._M_impl.
              super__Vector_impl_data._M_start;
    if (pptVar8 !=
        (consts->super__Vector_base<t_const_*,_std::allocator<t_const_*>_>)._M_impl.
        super__Vector_impl_data._M_finish) {
      do {
        pcVar3 = ((*pptVar8)->name_)._M_dataplus._M_p;
        local_430._M_dataplus._M_p = (pointer)paVar2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_430,pcVar3,pcVar3 + ((*pptVar8)->name_)._M_string_length);
        ttype = (*pptVar8)->type_;
        t_generator::indent_abi_cxx11_(&local_3b0,(t_generator *)this);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_1d0,local_3b0._M_dataplus._M_p,
                            local_3b0._M_string_length);
        type_name_abi_cxx11_(&local_3d0,this,ttype,false,false);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar5,local_3d0._M_dataplus._M_p,local_3d0._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar5,local_430._M_dataplus._M_p,local_430._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,";",1);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3d0._M_dataplus._M_p != &local_3d0.field_2) {
          operator_delete(local_3d0._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3b0._M_dataplus._M_p != &local_3b0.field_2) {
          operator_delete(local_3b0._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_430._M_dataplus._M_p != paVar2) {
          operator_delete(local_430._M_dataplus._M_p);
        }
        pptVar8 = pptVar8 + 1;
      } while (pptVar8 !=
               (consts->super__Vector_base<t_const_*,_std::allocator<t_const_*>_>)._M_impl.
               super__Vector_impl_data._M_finish);
    }
    piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
    *piVar1 = *piVar1 + -1;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1d0,"};",2);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1d0,::endl_abi_cxx11_._M_dataplus._M_p,
               ::endl_abi_cxx11_._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_370,"const ",6);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_370,
                        (this->super_t_oop_generator).super_t_generator.program_name_._M_dataplus.
                        _M_p,(this->super_t_oop_generator).super_t_generator.program_name_.
                             _M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"Constants g_",0xc);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar5,(this->super_t_oop_generator).super_t_generator.program_name_.
                               _M_dataplus._M_p,
                        (this->super_t_oop_generator).super_t_generator.program_name_.
                        _M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"_constants;",0xb);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length
                       );
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length
                       );
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar5,(this->super_t_oop_generator).super_t_generator.program_name_.
                               _M_dataplus._M_p,
                        (this->super_t_oop_generator).super_t_generator.program_name_.
                        _M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"Constants::",0xb);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar5,(this->super_t_oop_generator).super_t_generator.program_name_.
                               _M_dataplus._M_p,
                        (this->super_t_oop_generator).super_t_generator.program_name_.
                        _M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"Constants() {",0xd);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
    *piVar1 = *piVar1 + 1;
    pptVar8 = (consts->super__Vector_base<t_const_*,_std::allocator<t_const_*>_>)._M_impl.
              super__Vector_impl_data._M_start;
    if (pptVar8 !=
        (consts->super__Vector_base<t_const_*,_std::allocator<t_const_*>_>)._M_impl.
        super__Vector_impl_data._M_finish) {
      do {
        pcVar3 = ((*pptVar8)->name_)._M_dataplus._M_p;
        local_390._M_dataplus._M_p = (pointer)&local_390.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_390,pcVar3,pcVar3 + ((*pptVar8)->name_)._M_string_length);
        print_const_value(this,(ostream *)local_370,&local_390,(*pptVar8)->type_,(*pptVar8)->value_)
        ;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_390._M_dataplus._M_p != &local_390.field_2) {
          operator_delete(local_390._M_dataplus._M_p);
        }
        pptVar8 = pptVar8 + 1;
      } while (pptVar8 !=
               (consts->super__Vector_base<t_const_*,_std::allocator<t_const_*>_>)._M_impl.
               super__Vector_impl_data._M_finish);
    }
    piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
    *piVar1 = *piVar1 + -1;
    poVar5 = t_generator::indent((t_generator *)this,(ostream *)local_370);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"}",1);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1d0,::endl_abi_cxx11_._M_dataplus._M_p,
                        ::endl_abi_cxx11_._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"extern const ",0xd);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar5,(this->super_t_oop_generator).super_t_generator.program_name_.
                               _M_dataplus._M_p,
                        (this->super_t_oop_generator).super_t_generator.program_name_.
                        _M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"Constants g_",0xc);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar5,(this->super_t_oop_generator).super_t_generator.program_name_.
                               _M_dataplus._M_p,
                        (this->super_t_oop_generator).super_t_generator.program_name_.
                        _M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"_constants;",0xb);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length
                       );
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length
                       );
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar5,(this->ns_close_)._M_dataplus._M_p,(this->ns_close_)._M_string_length
                       );
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length
                       );
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length
                       );
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"#endif",6);
    _Var9 = ::endl_abi_cxx11_._M_dataplus;
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::close
              ((template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>
                *)local_1d0,(int)_Var9._M_p);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_370,::endl_abi_cxx11_._M_dataplus._M_p,
                        ::endl_abi_cxx11_._M_string_length);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar5,(this->ns_close_)._M_dataplus._M_p,(this->ns_close_)._M_string_length
                       );
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length
                       );
    _Var9 = ::endl_abi_cxx11_._M_dataplus;
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::close
              ((template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>
                *)local_370,(int)_Var9._M_p);
    template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::
    ~template_ofstream_with_content_based_conditional_update
              ((template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>
                *)local_370,
               &template_ofstream_with_content_based_conditional_update<char,std::char_traits<char>>
                ::VTT);
    std::ios_base::~ios_base(local_2d8);
    if (local_3f0 != &local_3e0) {
      operator_delete(local_3f0);
    }
  }
  template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::
  ~template_ofstream_with_content_based_conditional_update
            ((template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>
              *)local_1d0,
             &template_ofstream_with_content_based_conditional_update<char,std::char_traits<char>>::
              VTT);
  std::ios_base::~ios_base(local_138);
  if (local_410 != &local_400) {
    operator_delete(local_410);
  }
  return;
}

Assistant:

void t_cpp_generator::generate_consts(std::vector<t_const*> consts) {
  string f_consts_name = get_out_dir() + program_name_ + "_constants.h";
  ofstream_with_content_based_conditional_update f_consts;
  if (consts.size() > 0) {
    f_consts.open(f_consts_name);

    string f_consts_impl_name = get_out_dir() + program_name_ + "_constants.cpp";
    ofstream_with_content_based_conditional_update f_consts_impl;
    f_consts_impl.open(f_consts_impl_name);

    // Print header
    f_consts << autogen_comment();
    f_consts_impl << autogen_comment();

    // Start ifndef
    f_consts << "#ifndef " << program_name_ << "_CONSTANTS_H" << endl << "#define " << program_name_
             << "_CONSTANTS_H" << endl << endl << "#include \"" << get_include_prefix(*get_program())
             << program_name_ << "_types.h\"" << endl << endl << ns_open_ << endl << endl;

    f_consts_impl << "#include \"" << get_include_prefix(*get_program()) << program_name_
                  << "_constants.h\"" << endl << endl << ns_open_ << endl << endl;

    f_consts << "class " << program_name_ << "Constants {" << endl << " public:" << endl << "  "
             << program_name_ << "Constants();" << endl << endl;
    indent_up();
    vector<t_const*>::iterator c_iter;
    for (c_iter = consts.begin(); c_iter != consts.end(); ++c_iter) {
      string name = (*c_iter)->get_name();
      t_type* type = (*c_iter)->get_type();
      f_consts << indent() << type_name(type) << " " << name << ";" << endl;
    }
    indent_down();
    f_consts << "};" << endl;

    f_consts_impl << "const " << program_name_ << "Constants g_" << program_name_ << "_constants;"
                  << endl << endl << program_name_ << "Constants::" << program_name_
                  << "Constants() {" << endl;
    indent_up();
    for (c_iter = consts.begin(); c_iter != consts.end(); ++c_iter) {
      print_const_value(f_consts_impl,
                        (*c_iter)->get_name(),
                        (*c_iter)->get_type(),
                        (*c_iter)->get_value());
    }
    indent_down();
    indent(f_consts_impl) << "}" << endl;

    f_consts << endl << "extern const " << program_name_ << "Constants g_" << program_name_
             << "_constants;" << endl << endl << ns_close_ << endl << endl << "#endif" << endl;
    f_consts.close();

    f_consts_impl << endl << ns_close_ << endl << endl;
    f_consts_impl.close();
  }
}